

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_expr.hh
# Opt level: O3

Const * convert_int_to_const<kratos::Var>(int64_t value,Var *var)

{
  bool is_signed;
  uint32_t width;
  Const *pCVar1;
  
  is_signed = var->is_signed_;
  width = (*(var->super_IRNode)._vptr_IRNode[7])(var);
  pCVar1 = kratos::Const::constant(value,width,is_signed);
  if (var->width_param_ != (Var *)0x0) {
    (*(pCVar1->super_Var).super_IRNode._vptr_IRNode[0x23])(pCVar1);
  }
  return pCVar1;
}

Assistant:

kratos::Const &convert_int_to_const(int64_t value, T &var) {
    bool is_signed = var.is_signed();
    uint32_t width = var.width();
    auto &c = kratos::constant(value, width, is_signed);
    if (var.parametrized()) c.set_width_param(var.width_param());
    return c;
}